

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

void type_safe::
     with<type_safe::optional_variant_policy,int,double,debugger_type,C_A_T_C_H_T_E_S_T_0()::visitor&>
               (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                *variant,visitor *func)

{
  unsigned_long uVar1;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  SourceLineInfo local_e8;
  undefined8 local_d8;
  BinaryExpr<const_double_&,_const_double_&> local_d0;
  AssertionHandler catchAssertionHandler;
  double local_58;
  undefined1 local_50 [16];
  StringRef local_40;
  
  uVar1 = (variant->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  if (uVar1 == 2) {
    tagged_union<int,_double,_debugger_type>::check<double>
              ((tagged_union<int,_double,_debugger_type> *)variant);
    local_d8 = *(undefined8 *)(variant->storage_).storage_.storage_.storage_;
    local_d0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_d0.super_ITransientExpression.m_isBinaryExpression = true;
    local_d0.super_ITransientExpression.m_result = false;
    local_d0.super_ITransientExpression._10_6_ = 0;
    local_e8.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e8.line = 0x22f;
    Catch::StringRef::StringRef(&local_40,"i == 2");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_d0,&local_e8,local_40,Normal);
    local_50._0_4_ = 2;
    local_e8.file = (char *)func;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_d0,(ExprLhs<int_const&> *)&local_e8,
               (int *)local_50);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_d0.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_d0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_d0.super_ITransientExpression.m_isBinaryExpression = true;
    local_d0.super_ITransientExpression.m_result = false;
    local_d0.super_ITransientExpression._10_6_ = 0;
    local_e8.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e8.line = 0x230;
    Catch::StringRef::StringRef((StringRef *)local_50,"f == 3.14");
    capturedExpression_00._4_12_ = local_50._4_12_;
    capturedExpression_00.m_start._0_4_ = local_50._0_4_;
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_d0,&local_e8,capturedExpression_00,Normal)
    ;
    local_e8.file = (char *)&local_d8;
    local_58 = 3.14;
    Catch::ExprLhs<double_const&>::operator==
              (&local_d0,(ExprLhs<double_const&> *)&local_e8,&local_58);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_d0.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
  }
  else {
    if (uVar1 != 1) {
      return;
    }
    tagged_union<int,_double,_debugger_type>::check<int>
              ((tagged_union<int,_double,_debugger_type> *)variant);
    local_d8 = CONCAT44(local_d8._4_4_,*(undefined4 *)(variant->storage_).storage_.storage_.storage_
                       );
    local_d0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_d0.super_ITransientExpression.m_isBinaryExpression = true;
    local_d0.super_ITransientExpression.m_result = false;
    local_d0.super_ITransientExpression._10_6_ = 0;
    local_e8.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e8.line = 0x229;
    Catch::StringRef::StringRef(&local_40,"i == 1");
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_d0,&local_e8,local_40,Normal);
    local_50._0_4_ = 1;
    local_e8.file = (char *)func;
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_d0,(ExprLhs<int_const&> *)&local_e8,
               (int *)local_50);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_d0.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    local_d0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1c48db;
    local_d0.super_ITransientExpression.m_isBinaryExpression = true;
    local_d0.super_ITransientExpression.m_result = false;
    local_d0.super_ITransientExpression._10_6_ = 0;
    local_e8.file =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp";
    local_e8.line = 0x22a;
    Catch::StringRef::StringRef((StringRef *)local_50,"val == 5");
    capturedExpression._4_12_ = local_50._4_12_;
    capturedExpression.m_start._0_4_ = local_50._0_4_;
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,(StringRef *)&local_d0,&local_e8,capturedExpression,Normal);
    local_e8.file = (char *)&local_d8;
    local_58 = (double)CONCAT44(local_58._4_4_,5);
    Catch::ExprLhs<int_const&>::operator==
              ((BinaryExpr<const_int_&,_const_int_&> *)&local_d0,(ExprLhs<int_const&> *)&local_e8,
               (int *)&local_58);
    Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_d0.super_ITransientExpression)
    ;
    Catch::ITransientExpression::~ITransientExpression(&local_d0.super_ITransientExpression);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
  }
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void with(basic_variant<VariantPolicy, Head, Types...>& variant, Func&& func,
          Args&&... additional_args)
{
    with(detail::storage_access::get(variant).get_union(), std::forward<Func>(func),
         std::forward<Args>(additional_args)...);
}